

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TIntermediate::foldSwizzle
          (TIntermediate *this,TIntermTyped *node,TSwizzleSelectors<int> *selectors,TSourceLoc *loc)

{
  long lVar1;
  pointer pTVar2;
  int iVar3;
  int iVar4;
  TBasicType t;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermConstantUnion *pTVar5;
  int i;
  long lVar6;
  long lVar7;
  TConstUnionArray constArray;
  TType local_c8;
  
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[5])(node);
  TConstUnionArray::TConstUnionArray(&constArray,selectors->size_);
  lVar7 = 0;
  for (lVar6 = 0; lVar6 < selectors->size_; lVar6 = lVar6 + 1) {
    iVar4 = TSwizzleSelectors<int>::operator[](selectors,(int)lVar6);
    lVar1 = *(long *)(*(long *)(CONCAT44(extraout_var,iVar3) + 0xc0) + 8);
    pTVar2 = ((constArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)&pTVar2->type + lVar7) = *(undefined4 *)(lVar1 + 8 + (long)iVar4 * 0x10);
    *(undefined8 *)((long)&pTVar2->field_0 + lVar7) = *(undefined8 *)(lVar1 + (long)iVar4 * 0x10);
    lVar7 = lVar7 + 0x10;
  }
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  pTVar5 = addConstantUnion(this,&constArray,(TType *)CONCAT44(extraout_var_00,iVar3),loc,false);
  if (pTVar5 != (TIntermConstantUnion *)0x0) {
    t = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
    TType::TType(&local_c8,t,EvqConst,selectors->size_,0,0,false);
    (*(pTVar5->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])(pTVar5,&local_c8);
    node = &pTVar5->super_TIntermTyped;
  }
  return &((TIntermConstantUnion *)node)->super_TIntermTyped;
}

Assistant:

TIntermTyped* TIntermediate::foldSwizzle(TIntermTyped* node, TSwizzleSelectors<TVectorSelector>& selectors, const TSourceLoc& loc)
{
    const TConstUnionArray& unionArray = node->getAsConstantUnion()->getConstArray();
    TConstUnionArray constArray(selectors.size());

    for (int i = 0; i < selectors.size(); i++)
        constArray[i] = unionArray[selectors[i]];

    TIntermTyped* result = addConstantUnion(constArray, node->getType(), loc);

    if (result == nullptr)
        result = node;
    else
        result->setType(TType(node->getBasicType(), EvqConst, selectors.size()));

    return result;
}